

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_matvec_multiply(Integer s_a,Integer g_a,Integer g_v)

{
  double *pdVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  Integer grp;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  long lVar11;
  Integer iproc;
  undefined1 (*__s) [16];
  long lVar12;
  void *buf;
  undefined1 (*pauVar13) [16];
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  Integer khi;
  Integer klo;
  Integer one;
  Integer jhi;
  Integer jlo;
  int *jptr;
  int *iptr;
  int64_t *jlptr;
  int64_t *ilptr;
  void *vptr;
  Integer vtype;
  Integer atype;
  Integer vrank;
  double one_r;
  Integer arank;
  Integer ihi;
  Integer ilo;
  Integer dims [7];
  long local_160;
  long local_158;
  long local_150;
  Integer local_148;
  long local_140;
  Integer local_138;
  long local_130;
  long local_128;
  size_t local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  size_t local_f8;
  long local_f0;
  long local_e8;
  Integer local_e0;
  long local_d8;
  size_t local_d0;
  long local_c8;
  Integer local_c0;
  long local_b8;
  Integer local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  long local_90 [3];
  long local_78;
  long local_70;
  long local_68 [7];
  
  lVar12 = s_a + 1000;
  grp = SPA[lVar12].grp;
  local_148 = g_a;
  local_e0 = g_v;
  iproc = pnga_pgroup_nodeid(grp);
  local_c0 = pnga_pgroup_nnodes(grp);
  local_a8 = (ulong)(uint)SPA[lVar12].idx_size;
  local_100 = 0;
  local_108 = 0;
  local_110 = 0;
  local_118 = 0;
  local_90[1] = 0x3ff0000000000000;
  local_138 = 1;
  lVar22 = (long)_ga_sync_begin;
  local_c8 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_f0 = lVar12 * 200;
  if (lVar22 != 0) {
    pnga_pgroup_sync(grp);
  }
  local_b0 = grp;
  pnga_inquire(local_148,&local_98,local_90 + 2,local_68);
  lVar12 = local_68[0];
  pnga_inquire(local_e0,&local_a0,local_90,local_68);
  if (local_90[2] != 1) {
    pnga_error("rank of A must be 1 (vector)",local_90[2]);
  }
  if (local_90[0] != 1) {
    pnga_error("rank of V must be 1 (vector)",local_90[0]);
  }
  lVar11 = local_f0;
  if (lVar12 != *(long *)((long)&SPA->jdim + local_f0)) {
    pnga_error("length of A must equal second dimension of sparse matrix",lVar12);
    lVar12 = *(long *)((long)&SPA->jdim + lVar11);
  }
  if (local_68[0] != lVar12) {
    pnga_error("length of V must equal second dimension of sparse matrix",local_68[0]);
  }
  lVar11 = local_f0;
  lVar12 = *(long *)((long)&SPA->type + local_f0);
  if ((local_98 != lVar12) || (local_a0 != lVar12)) {
    pnga_error("Data type of sparse matrix and A and V vectors must match",lVar12);
    local_98 = *(long *)((long)&SPA->type + lVar11);
  }
  if (local_98 == 0x3f8) {
    pnga_error("Data type of sparse matrix and A and V vectors cannot be of type long long",0x3f8);
  }
  pnga_mask_sync(lVar22,local_c8);
  pnga_zero(local_e0);
  pnga_sprs_array_row_distribution(s_a,iproc,&local_70,&local_78);
  local_b8 = local_78 + 1;
  __s = (undefined1 (*) [16])malloc((local_b8 - local_70) * *(long *)((long)&SPA->size + lVar11));
  if (0 < local_c0) {
    lVar12 = local_78 - local_70;
    local_e8 = lVar12 + 1;
    local_d0 = local_e8 * 0x10;
    local_120 = lVar12 * 8 + 8;
    local_f8 = lVar12 * 4 + 4;
    local_140 = 1;
    lVar12 = 0;
    do {
      pnga_sprs_array_column_distribution(s_a,lVar12,&local_128,&local_130);
      if ((int)local_a8 == 4) {
        pnga_sprs_array_access_col_block(s_a,lVar12,&local_110,&local_118,&local_d8);
        lVar15 = local_d8;
        lVar11 = local_128;
        lVar22 = local_130;
        if (local_d8 != 0) {
          switch(*(undefined8 *)((long)&SPA->type + local_f0)) {
          case 0x3e9:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 4 + 4);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_f8);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                iVar19 = *(int *)(local_110 + ((lVar22 + 1) - local_70) * 4);
                lVar16 = lVar22 - local_70;
                iVar18 = *(int *)(local_110 + lVar16 * 4);
                lVar17 = (long)iVar18;
                if (iVar18 < iVar19) {
                  iVar18 = *(int *)((long)__s + lVar16 * 4);
                  do {
                    iVar18 = iVar18 + *(int *)((long)buf +
                                              (*(int *)(local_118 + lVar17 * 4) - lVar11) * 4) *
                                      *(int *)(lVar15 + lVar17 * 4);
                    *(int *)((long)__s + lVar16 * 4) = iVar18;
                    lVar17 = lVar17 + 1;
                  } while (iVar19 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
            break;
          case 0x3ea:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 8 + 8);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_120);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                iVar19 = *(int *)(local_110 + ((lVar22 + 1) - local_70) * 4);
                lVar16 = lVar22 - local_70;
                iVar18 = *(int *)(local_110 + lVar16 * 4);
                lVar17 = (long)iVar18;
                if (iVar18 < iVar19) {
                  lVar20 = *(long *)((long)__s + lVar16 * 8);
                  do {
                    lVar20 = lVar20 + *(long *)((long)buf +
                                               (*(int *)(local_118 + lVar17 * 4) - lVar11) * 8) *
                                      *(long *)(lVar15 + lVar17 * 8);
                    *(long *)((long)__s + lVar16 * 8) = lVar20;
                    lVar17 = lVar17 + 1;
                  } while (iVar19 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
            break;
          case 0x3eb:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 4 + 4);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_f8);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                iVar19 = *(int *)(local_110 + ((lVar22 + 1) - local_70) * 4);
                lVar16 = lVar22 - local_70;
                iVar18 = *(int *)(local_110 + lVar16 * 4);
                lVar17 = (long)iVar18;
                if (iVar18 < iVar19) {
                  fVar24 = *(float *)((long)__s + lVar16 * 4);
                  do {
                    fVar24 = fVar24 + *(float *)(lVar15 + lVar17 * 4) *
                                      *(float *)((long)buf +
                                                (*(int *)(local_118 + lVar17 * 4) - lVar11) * 4);
                    *(float *)((long)__s + lVar16 * 4) = fVar24;
                    lVar17 = lVar17 + 1;
                  } while (iVar19 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
            break;
          case 0x3ec:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 8 + 8);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_120);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                iVar19 = *(int *)(local_110 + ((lVar22 + 1) - local_70) * 4);
                lVar16 = lVar22 - local_70;
                iVar18 = *(int *)(local_110 + lVar16 * 4);
                lVar17 = (long)iVar18;
                if (iVar18 < iVar19) {
                  dVar3 = *(double *)((long)__s + lVar16 * 8);
                  do {
                    dVar3 = dVar3 + *(double *)(lVar15 + lVar17 * 8) *
                                    *(double *)
                                     ((long)buf + (*(int *)(local_118 + lVar17 * 4) - lVar11) * 8);
                    *(double *)((long)__s + lVar16 * 8) = dVar3;
                    lVar17 = lVar17 + 1;
                  } while (iVar19 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
            break;
          default:
            goto switchD_0013c62f_caseD_3ed;
          case 0x3ee:
            local_150 = CONCAT71(local_150._1_7_,local_78 < local_70);
            buf = malloc((local_130 - local_128) * 8 + 8);
            if (local_140 != 0 && (char)local_150 == '\0') {
              memset(__s,0,local_120);
            }
            local_158 = lVar11 + 1;
            local_160 = lVar22 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            if (local_70 <= local_78) {
              lVar22 = 0;
              do {
                iVar19 = *(int *)(local_110 + 4 + lVar22 * 4);
                iVar18 = *(int *)(local_110 + lVar22 * 4);
                iVar14 = iVar19 - iVar18;
                if (iVar14 != 0 && iVar18 <= iVar19) {
                  lVar15 = (ulong)(iVar14 - 1) + (long)iVar18;
                  fVar24 = *(float *)((long)buf + lVar15 * 8);
                  fVar2 = *(float *)((long)buf + lVar15 * 8 + 4);
                  uVar5 = *(undefined8 *)
                           ((long)buf + (*(int *)(local_118 + lVar15 * 4) - lVar11) * 8);
                  fVar25 = (float)uVar5;
                  fVar26 = (float)((ulong)uVar5 >> 0x20);
                  *(ulong *)(*__s + lVar22 * 8) =
                       CONCAT44(fVar24 * fVar26 + fVar25 * fVar2,fVar24 * fVar25 + fVar26 * -fVar2);
                }
                lVar22 = lVar22 + 1;
              } while (local_e8 != lVar22);
            }
            break;
          case 0x3ef:
            local_150 = CONCAT71(local_150._1_7_,local_78 < local_70);
            buf = malloc((local_130 - local_128) * 0x10 + 0x10);
            if (local_140 != 0 && (char)local_150 == '\0') {
              memset(__s,0,local_d0);
            }
            local_158 = lVar11 + 1;
            local_160 = lVar22 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            if (local_70 <= local_78) {
              lVar22 = 0;
              pauVar13 = __s;
              do {
                iVar19 = *(int *)(local_110 + 4 + lVar22 * 4);
                iVar18 = *(int *)(local_110 + lVar22 * 4);
                iVar14 = iVar19 - iVar18;
                if (iVar14 != 0 && iVar18 <= iVar19) {
                  lVar15 = (ulong)(iVar14 - 1) + (long)iVar18;
                  lVar16 = lVar15 * 0x10;
                  dVar3 = *(double *)((long)buf + lVar16);
                  dVar4 = *(double *)((long)buf + lVar16 + 8);
                  pdVar1 = (double *)
                           ((long)buf + (*(int *)(local_118 + lVar15 * 4) - lVar11) * 0x10);
                  dVar9 = *pdVar1;
                  dVar10 = pdVar1[1];
                  dVar8 = dVar3 * dVar10 + dVar9 * dVar4;
                  auVar6._8_4_ = SUB84(dVar8,0);
                  auVar6._0_8_ = dVar3 * dVar9 + dVar10 * -dVar4;
                  auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
                  *pauVar13 = auVar6;
                }
                lVar22 = lVar22 + 1;
                pauVar13 = pauVar13 + 1;
              } while (local_e8 != lVar22);
            }
            break;
          case 0x3f8:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 8 + 8);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_120);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                iVar19 = *(int *)(local_110 + ((lVar22 + 1) - local_70) * 4);
                lVar16 = lVar22 - local_70;
                iVar18 = *(int *)(local_110 + lVar16 * 4);
                lVar17 = (long)iVar18;
                if (iVar18 < iVar19) {
                  lVar20 = *(long *)((long)__s + lVar16 * 8);
                  do {
                    lVar20 = lVar20 + *(long *)((long)buf +
                                               (*(int *)(local_118 + lVar17 * 4) - lVar11) * 8) *
                                      *(long *)(lVar15 + lVar17 * 8);
                    *(long *)((long)__s + lVar16 * 8) = lVar20;
                    lVar17 = lVar17 + 1;
                  } while (iVar19 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
          }
LAB_0013d332:
          free(buf);
          local_140 = 0;
        }
      }
      else {
        pnga_sprs_array_access_col_block(s_a,lVar12,&local_100,&local_108,&local_d8);
        lVar15 = local_d8;
        lVar11 = local_128;
        lVar22 = local_130;
        if (local_d8 != 0) {
          switch(*(undefined8 *)((long)&SPA->type + local_f0)) {
          case 0x3e9:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 4 + 4);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_f8);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                lVar16 = *(long *)(local_100 + ((lVar22 + 1) - local_70) * 8);
                lVar20 = lVar22 - local_70;
                lVar17 = *(long *)(local_100 + lVar20 * 8);
                if (lVar17 < lVar16) {
                  iVar19 = *(int *)((long)__s + lVar20 * 4);
                  do {
                    iVar19 = iVar19 + *(int *)((long)buf +
                                              (*(long *)(local_108 + lVar17 * 8) - lVar11) * 4) *
                                      *(int *)(lVar15 + lVar17 * 4);
                    *(int *)((long)__s + lVar20 * 4) = iVar19;
                    lVar17 = lVar17 + 1;
                  } while (lVar16 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
            break;
          case 0x3ea:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 8 + 8);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_120);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                lVar16 = *(long *)(local_100 + ((lVar22 + 1) - local_70) * 8);
                lVar20 = lVar22 - local_70;
                lVar17 = *(long *)(local_100 + lVar20 * 8);
                if (lVar17 < lVar16) {
                  lVar21 = *(long *)((long)__s + lVar20 * 8);
                  do {
                    lVar21 = lVar21 + *(long *)((long)buf +
                                               (*(long *)(local_108 + lVar17 * 8) - lVar11) * 8) *
                                      *(long *)(lVar15 + lVar17 * 8);
                    *(long *)((long)__s + lVar20 * 8) = lVar21;
                    lVar17 = lVar17 + 1;
                  } while (lVar16 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
            break;
          case 0x3eb:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 4 + 4);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_f8);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                lVar16 = *(long *)(local_100 + ((lVar22 + 1) - local_70) * 8);
                lVar20 = lVar22 - local_70;
                lVar17 = *(long *)(local_100 + lVar20 * 8);
                if (lVar17 < lVar16) {
                  fVar24 = *(float *)((long)__s + lVar20 * 4);
                  do {
                    fVar24 = fVar24 + *(float *)(lVar15 + lVar17 * 4) *
                                      *(float *)((long)buf +
                                                (*(long *)(local_108 + lVar17 * 8) - lVar11) * 4);
                    *(float *)((long)__s + lVar20 * 4) = fVar24;
                    lVar17 = lVar17 + 1;
                  } while (lVar16 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
            break;
          case 0x3ec:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 8 + 8);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_120);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                lVar16 = *(long *)(local_100 + ((lVar22 + 1) - local_70) * 8);
                lVar20 = lVar22 - local_70;
                lVar17 = *(long *)(local_100 + lVar20 * 8);
                if (lVar17 < lVar16) {
                  dVar3 = *(double *)((long)__s + lVar20 * 8);
                  do {
                    dVar3 = dVar3 + *(double *)(lVar15 + lVar17 * 8) *
                                    *(double *)
                                     ((long)buf + (*(long *)(local_108 + lVar17 * 8) - lVar11) * 8);
                    *(double *)((long)__s + lVar20 * 8) = dVar3;
                    lVar17 = lVar17 + 1;
                  } while (lVar16 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
            break;
          default:
            goto switchD_0013c62f_caseD_3ed;
          case 0x3ee:
            local_150 = CONCAT71(local_150._1_7_,local_78 < local_70);
            buf = malloc((local_130 - local_128) * 8 + 8);
            if (local_140 != 0 && (char)local_150 == '\0') {
              memset(__s,0,local_120);
            }
            local_158 = lVar11 + 1;
            local_160 = lVar22 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            if (local_70 <= local_78) {
              lVar22 = 0;
              do {
                lVar15 = *(long *)(local_100 + 8 + lVar22 * 8);
                if (*(long *)(local_100 + lVar22 * 8) < lVar15) {
                  fVar24 = *(float *)((long)buf + lVar15 * 8 + -8);
                  fVar2 = *(float *)((long)buf + lVar15 * 8 + -4);
                  uVar5 = *(undefined8 *)
                           ((long)buf + (*(long *)(local_108 + -8 + lVar15 * 8) - lVar11) * 8);
                  fVar25 = (float)uVar5;
                  fVar26 = (float)((ulong)uVar5 >> 0x20);
                  *(ulong *)(*__s + lVar22 * 8) =
                       CONCAT44(fVar24 * fVar26 + fVar25 * fVar2,fVar24 * fVar25 + fVar26 * -fVar2);
                }
                lVar22 = lVar22 + 1;
              } while (local_e8 != lVar22);
            }
            break;
          case 0x3ef:
            local_150 = CONCAT71(local_150._1_7_,local_78 < local_70);
            buf = malloc((local_130 - local_128) * 0x10 + 0x10);
            if (local_140 != 0 && (char)local_150 == '\0') {
              memset(__s,0,local_d0);
            }
            local_158 = lVar11 + 1;
            local_160 = lVar22 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            if (local_70 <= local_78) {
              lVar22 = 0;
              pauVar13 = __s;
              do {
                lVar15 = *(long *)(local_100 + 8 + lVar22 * 8);
                if (*(long *)(local_100 + lVar22 * 8) < lVar15) {
                  lVar16 = (lVar15 + -1) * 0x10;
                  dVar3 = *(double *)((long)buf + lVar16);
                  dVar4 = *(double *)((long)buf + lVar16 + 8);
                  pdVar1 = (double *)
                           ((long)buf + (*(long *)(local_108 + -8 + lVar15 * 8) - lVar11) * 0x10);
                  dVar9 = *pdVar1;
                  dVar10 = pdVar1[1];
                  dVar8 = dVar3 * dVar10 + dVar9 * dVar4;
                  auVar7._8_4_ = SUB84(dVar8,0);
                  auVar7._0_8_ = dVar3 * dVar9 + dVar10 * -dVar4;
                  auVar7._12_4_ = (int)((ulong)dVar8 >> 0x20);
                  *pauVar13 = auVar7;
                }
                lVar22 = lVar22 + 1;
                pauVar13 = pauVar13 + 1;
              } while (local_e8 != lVar22);
            }
            break;
          case 0x3f8:
            local_150 = local_130;
            buf = malloc((local_130 - local_128) * 8 + 8);
            if (local_140 != 0 && local_70 <= local_78) {
              memset(__s,0,local_120);
            }
            local_158 = lVar11 + 1;
            local_160 = local_150 + 1;
            pnga_get(local_148,&local_158,&local_160,buf,&local_138);
            lVar22 = local_70;
            if (local_70 <= local_78) {
              do {
                lVar16 = *(long *)(local_100 + ((lVar22 + 1) - local_70) * 8);
                lVar20 = lVar22 - local_70;
                lVar17 = *(long *)(local_100 + lVar20 * 8);
                if (lVar17 < lVar16) {
                  lVar21 = *(long *)((long)__s + lVar20 * 8);
                  do {
                    lVar21 = lVar21 + *(long *)((long)buf +
                                               (*(long *)(local_108 + lVar17 * 8) - lVar11) * 8) *
                                      *(long *)(lVar15 + lVar17 * 8);
                    *(long *)((long)__s + lVar20 * 8) = lVar21;
                    lVar17 = lVar17 + 1;
                  } while (lVar16 != lVar17);
                }
                bVar23 = lVar22 != local_78;
                lVar22 = lVar22 + 1;
              } while (bVar23);
            }
          }
          goto LAB_0013d332;
        }
      }
switchD_0013c62f_caseD_3ed:
      lVar12 = lVar12 + 1;
    } while (lVar12 != local_c0);
  }
  if (local_70 <= local_78) {
    local_158 = local_70 + 1;
    local_160 = local_b8;
    pnga_acc(local_e0,&local_158,&local_160,__s,&local_138,local_90 + 1);
  }
  if ((int)local_c8 != 0) {
    pnga_pgroup_sync(local_b0);
  }
  free(__s);
  return;
}

Assistant:

void pnga_sprs_array_matvec_multiply(Integer s_a, Integer g_a, Integer g_v)
{
  Integer s_hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer s_grp = SPA[s_hdl].grp;
  Integer me = pnga_pgroup_nodeid(s_grp);
  Integer nproc = pnga_pgroup_nnodes(s_grp);

  Integer ilo, ihi, jlo, jhi, klo, khi;
  void  *vsum, *vptr;
  int idx_size = SPA[s_hdl].idx_size;
  int64_t *ilptr = NULL, *jlptr = NULL;
  int *iptr = NULL, *jptr = NULL;
  Integer i, j, iproc, ncols;
  double one_r = 1.0;
  Integer one = 1;
  Integer adim, vdim, arank, vrank, dims[GA_MAX_DIM];
  Integer atype, vtype;
  Integer zflag;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(s_grp);
  /* Check that g_hdl and v_hdl are both vectors and that sizes
   * match */
  pnga_inquire(g_a, &atype, &arank, dims);
  adim = dims[0];
  pnga_inquire(g_v, &vtype, &vrank, dims);
  vdim = dims[0];
  if (arank != 1) pnga_error("rank of A must be 1 (vector)",arank);
  if (vrank != 1) pnga_error("rank of V must be 1 (vector)",vrank);
  if (adim != SPA[s_hdl].jdim) {
    pnga_error("length of A must equal second dimension of sparse matrix",adim);
  }
  if (vdim != SPA[s_hdl].jdim) {
    pnga_error("length of V must equal second dimension of sparse matrix",vdim);
  }
  if (atype != SPA[s_hdl].type || vtype != SPA[s_hdl].type) {
    pnga_error("Data type of sparse matrix and A and V vectors must match",
        SPA[s_hdl].type);
  }
  /* accumulate operation does not support type C_LONGLONG so fail if this
   * data type encountered */
  if (SPA[s_hdl].type == C_LONGLONG) {
    pnga_error("Data type of sparse matrix and A and V vectors"
        " cannot be of type long long",SPA[s_hdl].type);
  }


#define SPRS_REAL_MULTIPLY_M(_type,_iptr,_jptr)              \
  {                                                          \
    _type *_buf = (_type*)malloc((jhi-jlo+1)*sizeof(_type)); \
    _type *_sum = (_type*)vsum;                              \
    _type *_ptr = (_type*)vptr;                              \
    if (zflag) {                                             \
      for (i=ilo; i<=ihi; i++) {                             \
        _sum[i-ilo] = (_type)0;                              \
      }                                                      \
      zflag = 0;                                             \
    }                                                        \
    klo = jlo+1;                                             \
    khi = jhi+1;                                             \
    pnga_get(g_a,&klo,&khi,_buf,&one);                       \
    for (i=ilo; i<=ihi; i++) {                               \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                   \
      for (j=0; j<ncols; j++) {                              \
        _sum[i-ilo] += _ptr[_iptr[i-ilo]+j]                  \
                     * _buf[_jptr[_iptr[i-ilo]+j]-jlo];      \
      }                                                      \
    }                                                        \
    free(_buf);                                              \
  }
  
#define SPRS_COMPLEX_MULTIPLY_M(_type,_iptr,_jptr)             \
  {                                                            \
    _type *_buf = (_type*)malloc((jhi-jlo+1)*2*sizeof(_type)); \
    _type *_sum = (_type*)vsum;                                \
    _type *_ptr = (_type*)vptr;                                \
    _type rbuf,ibuf,rval,ival;                                 \
    if (zflag) {                                               \
      for (i=ilo; i<=ihi; i++) {                               \
        _sum[2*(i-ilo)] = 0.0;                                 \
        _sum[2*(i-ilo)+1] = 0.0;                               \
      }                                                        \
      zflag = 0;                                               \
    }                                                          \
    klo = jlo+1;                                               \
    khi = jhi+1;                                               \
    pnga_get(g_a,&klo,&khi,_buf,&one);                         \
    for (i=ilo; i<=ihi; i++) {                                 \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                     \
      for (j=0; j<ncols; j++) {                                \
            rbuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)];        \
            ibuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)+1];      \
            rval = _buf[2*(_iptr[i-ilo]+j)];                   \
            ival = _buf[2*(_iptr[i-ilo]+j)+1];                 \
            _sum[2*(i-ilo)] = rval*rbuf-ival*ibuf;             \
            _sum[2*(i-ilo)+1] = rval*ibuf+ival*rbuf;           \
      }                                                        \
    }                                                          \
    free(_buf);                                                \
  }
  
  /* Make sure product vector is zero */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_v);
  /* multiply sparse matrix by sparse vector */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  vsum = (void*)malloc((ihi-ilo+1)*SPA[s_hdl].size);
  zflag = 1;
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (SPA[s_hdl].type == C_INT) {
          SPRS_REAL_MULTIPLY_M(int,iptr,jptr);
        } else if (SPA[s_hdl].type == C_LONG) {
          SPRS_REAL_MULTIPLY_M(long,iptr,jptr);
        } else if (SPA[s_hdl].type == C_LONGLONG) {
          SPRS_REAL_MULTIPLY_M(long long,iptr,jptr);
        } else if (SPA[s_hdl].type == C_FLOAT) {
          SPRS_REAL_MULTIPLY_M(float,iptr,jptr);
        } else if (SPA[s_hdl].type == C_DBL) {
          SPRS_REAL_MULTIPLY_M(double,iptr,jptr);
        } else if (SPA[s_hdl].type == C_SCPL) {
          SPRS_COMPLEX_MULTIPLY_M(float,iptr,jptr);
        } else if (SPA[s_hdl].type == C_DCPL) {
          SPRS_COMPLEX_MULTIPLY_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (SPA[s_hdl].type == C_INT) {
          SPRS_REAL_MULTIPLY_M(int,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_LONG) {
          SPRS_REAL_MULTIPLY_M(long,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_LONGLONG) {
          SPRS_REAL_MULTIPLY_M(long long,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_FLOAT) {
          SPRS_REAL_MULTIPLY_M(float,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_DBL) {
          SPRS_REAL_MULTIPLY_M(double,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_SCPL) {
          SPRS_COMPLEX_MULTIPLY_M(float,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_DCPL) {
          SPRS_COMPLEX_MULTIPLY_M(double,ilptr,jlptr);
        }
      }
    }
  }
#undef SPRS_REAL_MULTIPLY_M
#undef SPRS_COMPLEX_MULTIPLY_M

  if (ihi>=ilo) {
    klo = ilo + 1;
    khi = ihi + 1;
    pnga_acc(g_v,&klo,&khi,vsum,&one,&one_r);
  }
  if (local_sync_end)  pnga_pgroup_sync(s_grp);
  free(vsum);
}